

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O3

lineiter_t * lineiter_start_clean(FILE *fh)

{
  char *string;
  lineiter_t *plVar1;
  
  plVar1 = lineiter_start(fh);
  if (plVar1 == (lineiter_t *)0x0) {
    plVar1 = (lineiter_t *)0x0;
  }
  else {
    plVar1->clean = 1;
    string = plVar1->buf;
    if ((string != (char *)0x0) && (*string == '#')) {
      plVar1 = lineiter_next(plVar1);
      return plVar1;
    }
    string_trim(string,STRING_BOTH);
  }
  return plVar1;
}

Assistant:

lineiter_t *
lineiter_start_clean(FILE *fh)
{
    lineiter_t *li;
    
    li = lineiter_start(fh);
    
    if (li == NULL)
	return li;
    
    li->clean = TRUE;
    
    if (li->buf && li->buf[0] == '#') {
	li = lineiter_next(li);
    } else {
	string_trim(li->buf, STRING_BOTH);
    }
    
    return li;
}